

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImRect *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiNavLayer IVar7;
  ImGuiContext *pIVar8;
  
  pIVar8 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x24e6,"void ImGui::SetFocusID(ImGuiID, ImGuiWindow *)");
  }
  IVar7 = (window->DC).NavLayerCurrent;
  if (GImGui->NavWindow != window) {
    GImGui->NavInitRequest = false;
  }
  pIVar8->NavWindow = window;
  pIVar8->NavId = id;
  pIVar8->NavLayer = IVar7;
  pIVar8->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
  window->NavLastIds[IVar7] = id;
  if ((pIVar8->LastItemData).ID == id) {
    fVar2 = (pIVar8->LastItemData).NavRect.Min.y;
    fVar3 = (window->Pos).x;
    fVar4 = (window->Pos).y;
    fVar5 = (pIVar8->LastItemData).NavRect.Max.x;
    fVar6 = (pIVar8->LastItemData).NavRect.Max.y;
    pIVar1 = window->NavRectRel + IVar7;
    (pIVar1->Min).x = (pIVar8->LastItemData).NavRect.Min.x - fVar3;
    (pIVar1->Min).y = fVar2 - fVar4;
    (pIVar1->Max).x = fVar5 - fVar3;
    (pIVar1->Max).y = fVar6 - fVar4;
  }
  if (pIVar8->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar8->NavDisableMouseHover = true;
    return;
  }
  pIVar8->NavDisableHighlight = true;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = ImRect(g.LastItemData.NavRect.Min - window->Pos, g.LastItemData.NavRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}